

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatMap.test.cpp
# Opt level: O0

bool __thiscall
EqualsRange<FlatMap<Point,_double,_PointCmp>_>::match
          (EqualsRange<FlatMap<Point,_double,_PointCmp>_> *this,FlatMap<Point,_double,_PointCmp> *in
          )

{
  __type_conflict _Var1;
  ostringstream s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  FlatMap<Point,_double,_PointCmp> *in_stack_fffffffffffffe58;
  ostream *in_stack_fffffffffffffe60;
  ostringstream local_188 [392];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  ::operator<<(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  std::__cxx11::ostringstream::str();
  _Var1 = std::operator==(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe48);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return _Var1;
}

Assistant:

virtual bool match(const T& in) const override {
        std::ostringstream s;
        s << in;
        return s.str() == expected_;
    }